

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test5(void)

{
  ostream *poVar1;
  int iVar2;
  int *x;
  int *piVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> v;
  Queue q;
  _Vector_base<int,_std::allocator<int>_> local_60;
  queue<int> local_48;
  
  CP::queue<int>::queue(&local_48);
  for (iVar2 = 0; iVar2 != 2000; iVar2 = iVar2 + 2) {
    local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar2;
    CP::queue<int>::push(&local_48,(int *)&local_60);
  }
  iVar2 = 200;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    CP::queue<int>::pop(&local_48);
  }
  CP::queue<int>::to_vector((vector<int,_std::allocator<int>_> *)&local_60,&local_48,200);
  for (piVar3 = (int *)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_60._M_impl.super__Vector_impl_data._M_start);
      piVar3 != local_60._M_impl.super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  CP::queue<int>::~queue(&local_48);
  return true;
}

Assistant:

bool test5() {
  Queue q;
  for (int i = 0;i < 1000;i++)
    q.push(i*2);
  for (int i = 0;i < 200;i++) q.pop();
  vector<int> v = q.to_vector(200);
  for (auto &x : v) {
    cout << x << " ";
  }
  cout << endl;
  return true;
}